

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

void ON_DimStyle::Internal_CreateFromProperties
               (ON_DimStyle *parent_dim_style,AnnotationType annotation_type,ON_Font *font,
               double model_space_text_scale,double text_height,
               LengthUnitSystem text_height_unit_system,bool bSetAlignment,
               TextVerticalAlignment valign,TextHorizontalAlignment halign,bool bSetOrientation,
               TextOrientation orientation,bool bSetLocation,TextLocation location,
               ON_DimStyle *destination)

{
  bool bVar1;
  LengthUnitSystem u1;
  TextHorizontalAlignment TVar2;
  TextVerticalAlignment TVar3;
  TextOrientation TVar4;
  TextLocation TVar5;
  int iVar6;
  ON_Font *rhs;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  bool local_7b;
  bool bOverrideDimRadialTextLocation;
  bool bOverrideDimTextLocation;
  bool bOverrideDimRadialOrientation;
  bool bOverrideDimOrientation;
  bool bOverrideLeaderOrientation;
  bool bOverrideTextOrientation;
  bool bOverrideLeaderVAlign;
  bool bOverrideTextVAlign;
  bool bOverrideLeaderHAlign;
  bool bOverrideTextHAlign;
  bool bSetDimRadialProps;
  bool bSetDimProps;
  bool bSetLeaderProps;
  bool bSetTextProps;
  bool bDimRadialType;
  bool bDimAngularType;
  bool bDimLinearType;
  bool bAllAnnotationTypes;
  double x;
  bool bSetLocation_local;
  bool bSetOrientation_local;
  TextVerticalAlignment valign_local;
  bool bSetAlignment_local;
  LengthUnitSystem text_height_unit_system_local;
  double text_height_local;
  double model_space_text_scale_local;
  ON_Font *font_local;
  AnnotationType annotation_type_local;
  ON_DimStyle *parent_dim_style_local;
  
  if (font != (ON_Font *)0x0) {
    rhs = Font(parent_dim_style);
    iVar6 = ON_Font::CompareFontCharacteristics(font,rhs);
    if (iVar6 != 0) {
      SetFont(destination,font);
    }
  }
  if ((0.0 < model_space_text_scale) &&
     (dVar14 = DimScale(parent_dim_style),
     model_space_text_scale * 0.001 < ABS(model_space_text_scale - dVar14))) {
    SetDimScale(destination,model_space_text_scale);
  }
  if (0.0 < text_height) {
    u1 = UnitSystem(parent_dim_style);
    dVar14 = ON::UnitScale(text_height_unit_system,u1);
    dVar14 = dVar14 * text_height;
    if ((0.0 < dVar14) &&
       (dVar15 = TextHeight(parent_dim_style), dVar14 * 0.001 < ABS(dVar14 - dVar15))) {
      SetTextHeight(destination,dVar14);
    }
  }
  bVar7 = annotation_type != Unset;
  local_7b = annotation_type == Radius || annotation_type == Diameter;
  bVar11 = !bVar7;
  bVar13 = annotation_type == Text;
  bVar12 = !bVar7;
  bVar8 = annotation_type == Leader;
  bVar9 = true;
  if (((bVar7) && (bVar9 = true, annotation_type != Aligned && annotation_type != Rotated)) &&
     (bVar9 = true, annotation_type != Angular && annotation_type != Angular3pt)) {
    bVar9 = annotation_type == Ordinate;
  }
  bVar1 = true;
  if (bVar7) {
    bVar1 = local_7b;
  }
  if (bSetAlignment) {
    bVar7 = false;
    if (bVar11 || bVar13) {
      TVar2 = TextHorizontalAlignment(parent_dim_style);
      bVar7 = halign != TVar2;
    }
    bVar10 = false;
    if (bVar12 || bVar8) {
      TVar2 = LeaderTextHorizontalAlignment(parent_dim_style);
      bVar10 = halign != TVar2;
    }
    if (bVar7) {
      SetTextHorizontalAlignment(destination,halign);
    }
    if (bVar10) {
      SetLeaderTextHorizontalAlignment(destination,halign);
    }
    bVar7 = false;
    if (bVar11 || bVar13) {
      TVar3 = TextVerticalAlignment(parent_dim_style);
      bVar7 = valign != TVar3;
    }
    bVar10 = false;
    if (bVar12 || bVar8) {
      TVar3 = LeaderTextVerticalAlignment(parent_dim_style);
      bVar10 = valign != TVar3;
    }
    if (bVar7) {
      SetTextVerticalAlignment(destination,valign);
    }
    if (bVar10) {
      SetLeaderTextVerticalAlignment(destination,valign);
    }
  }
  if (bSetOrientation) {
    bVar7 = false;
    if (bVar11 || bVar13) {
      TVar4 = TextOrientation(parent_dim_style);
      bVar7 = orientation != TVar4;
    }
    bVar11 = false;
    if (bVar12 || bVar8) {
      TVar4 = LeaderTextOrientation(parent_dim_style);
      bVar11 = orientation != TVar4;
    }
    bVar12 = false;
    if (bVar9) {
      TVar4 = DimTextOrientation(parent_dim_style);
      bVar12 = orientation != TVar4;
    }
    bVar13 = false;
    if (bVar1) {
      TVar4 = DimRadialTextOrientation(parent_dim_style);
      bVar13 = orientation != TVar4;
    }
    if (bVar7) {
      SetTextOrientation(destination,orientation);
    }
    if (bVar11) {
      SetLeaderTextOrientation(destination,orientation);
    }
    if (bVar12) {
      SetDimTextOrientation(destination,orientation);
    }
    if (bVar13) {
      SetDimRadialTextOrientation(destination,orientation);
    }
  }
  if (bSetLocation) {
    bVar11 = false;
    if (bVar9) {
      TVar5 = DimTextLocation(parent_dim_style);
      bVar11 = location != TVar5;
    }
    bVar12 = false;
    if (bVar1) {
      TVar5 = DimRadialTextLocation(parent_dim_style);
      bVar12 = location != TVar5;
    }
    if (bVar11) {
      SetDimTextLocation(destination,location);
    }
    if (bVar12) {
      SetDimRadialTextLocation(destination,location);
    }
  }
  return;
}

Assistant:

void ON_DimStyle::Internal_CreateFromProperties(
  const ON_DimStyle& parent_dim_style,
  ON::AnnotationType annotation_type,
  const ON_Font* font,
  double model_space_text_scale,
  double text_height,
  ON::LengthUnitSystem text_height_unit_system,
  bool bSetAlignment,
  ON::TextVerticalAlignment valign,
  ON::TextHorizontalAlignment halign,
  bool bSetOrientation,
  ON::TextOrientation orientation,
  bool bSetLocation,
  ON_DimStyle::TextLocation location,
  ON_DimStyle& destination
)
{
  if (nullptr != font)
  {
    if (0 != ON_Font::CompareFontCharacteristics(*font, parent_dim_style.Font()))
      destination.SetFont(*font);
  }

  if (model_space_text_scale > 0.0)
  {
    if (fabs(model_space_text_scale - parent_dim_style.DimScale()) > 0.001*model_space_text_scale )
      destination.SetDimScale(model_space_text_scale);
  }

  if (text_height > 0.0)
  {
    double x = ON::UnitScale(text_height_unit_system, parent_dim_style.UnitSystem())*text_height;
    if (x > 0.0 && fabs(x - parent_dim_style.TextHeight()) > 0.001*x )
      destination.SetTextHeight(x);
  }

  /////////////////////////////////////////////////
  //
  // Use annotation_type parameter to determine what annotation types are effected by the settings
  //
  const bool bAllAnnotationTypes = (ON::AnnotationType::Unset == annotation_type);
  const bool bDimLinearType 
    = ON::AnnotationType::Aligned == annotation_type 
    || ON::AnnotationType::Rotated == annotation_type
    ;
  const bool bDimAngularType 
    = ON::AnnotationType::Angular == annotation_type
    || ON::AnnotationType::Angular3pt == annotation_type
    ;
  const bool bDimRadialType 
    = ON::AnnotationType::Radius == annotation_type
    || ON::AnnotationType::Diameter == annotation_type
    ;

  const bool bSetTextProps 
    = (bAllAnnotationTypes || ON::AnnotationType::Text == annotation_type);

  const bool bSetLeaderProps
    = (bAllAnnotationTypes || ON::AnnotationType::Leader == annotation_type);

  const bool bSetDimProps
    = (bAllAnnotationTypes || bDimLinearType || bDimAngularType || ON::AnnotationType::Ordinate == annotation_type);

  const bool bSetDimRadialProps
    = (bAllAnnotationTypes || bDimRadialType);

  /////////////////////////////////////////////////
  //
  // Override type specific properties as needed
  //
  if (bSetAlignment)
  {
    const bool bOverrideTextHAlign = bSetTextProps && halign != parent_dim_style.TextHorizontalAlignment();
    const bool bOverrideLeaderHAlign = bSetLeaderProps && halign != parent_dim_style.LeaderTextHorizontalAlignment();
    if (bOverrideTextHAlign)
      destination.SetTextHorizontalAlignment(halign);
    if (bOverrideLeaderHAlign)
      destination.SetLeaderTextHorizontalAlignment(halign);

    const bool bOverrideTextVAlign = bSetTextProps && valign != parent_dim_style.TextVerticalAlignment();
    const bool bOverrideLeaderVAlign = bSetLeaderProps && valign != parent_dim_style.LeaderTextVerticalAlignment();
    if (bOverrideTextVAlign)
      destination.SetTextVerticalAlignment(valign);
    if (bOverrideLeaderVAlign)
      destination.SetLeaderTextVerticalAlignment(valign);
  }
  
  if (bSetOrientation)
  {
    const bool bOverrideTextOrientation = bSetTextProps && orientation != parent_dim_style.TextOrientation();
    const bool bOverrideLeaderOrientation = bSetLeaderProps && orientation != parent_dim_style.LeaderTextOrientation();
    const bool bOverrideDimOrientation = bSetDimProps && orientation != parent_dim_style.DimTextOrientation();
    const bool bOverrideDimRadialOrientation = bSetDimRadialProps && orientation != parent_dim_style.DimRadialTextOrientation();
    if (bOverrideTextOrientation)
      destination.SetTextOrientation(orientation);
    if (bOverrideLeaderOrientation)
      destination.SetLeaderTextOrientation(orientation);
    if (bOverrideDimOrientation)
      destination.SetDimTextOrientation(orientation);
    if (bOverrideDimRadialOrientation)
      destination.SetDimRadialTextOrientation(orientation);
  }

  if (bSetLocation)
  {
    const bool bOverrideDimTextLocation = bSetDimProps && location != parent_dim_style.DimTextLocation();
    const bool bOverrideDimRadialTextLocation = bSetDimRadialProps && location != parent_dim_style.DimRadialTextLocation();
    if (bOverrideDimTextLocation)
      destination.SetDimTextLocation(location);
    if (bOverrideDimRadialTextLocation)
      destination.SetDimRadialTextLocation(location);
  }
}